

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O0

int __thiscall FIWadManager::ScanIWAD(FIWadManager *this,char *iwad)

{
  bool bVar1;
  DWORD DVar2;
  int iVar3;
  FResourceFile *this_00;
  undefined4 extraout_var;
  char *pcVar4;
  char *__s;
  size_t len;
  FString local_38;
  FString mapname;
  FResourceLump *lump;
  DWORD ii;
  FResourceFile *iwadfile;
  char *iwad_local;
  FIWadManager *this_local;
  
  this_00 = FResourceFile::OpenResourceFile(iwad,(FileReader *)0x0,true,false);
  if (this_00 != (FResourceFile *)0x0) {
    ClearChecks(this);
    for (lump._4_4_ = 0; DVar2 = FResourceFile::LumpCount(this_00), lump._4_4_ < DVar2;
        lump._4_4_ = lump._4_4_ + 1) {
      iVar3 = (*this_00->_vptr_FResourceFile[4])(this_00,(ulong)lump._4_4_);
      mapname.Chars = (char *)CONCAT44(extraout_var,iVar3);
      CheckLumpName(this,mapname.Chars + 0x18);
      bVar1 = FString::IsNotEmpty((FString *)(mapname.Chars + 0x10));
      if (bVar1) {
        pcVar4 = FString::operator_cast_to_char_((FString *)(mapname.Chars + 0x10));
        iVar3 = strncasecmp(pcVar4,"maps/",5);
        if (iVar3 == 0) {
          pcVar4 = FString::operator[]((FString *)(mapname.Chars + 0x10),5);
          __s = FString::operator[]((FString *)(mapname.Chars + 0x10),5);
          len = strcspn(__s,".");
          FString::FString(&local_38,pcVar4,len);
          pcVar4 = FString::operator_cast_to_char_(&local_38);
          CheckLumpName(this,pcVar4);
          FString::~FString(&local_38);
        }
      }
    }
    if (this_00 != (FResourceFile *)0x0) {
      (*this_00->_vptr_FResourceFile[1])();
    }
  }
  iVar3 = GetIWadInfo(this);
  return iVar3;
}

Assistant:

int FIWadManager::ScanIWAD (const char *iwad)
{
	FResourceFile *iwadfile = FResourceFile::OpenResourceFile(iwad, NULL, true);

	if (iwadfile != NULL)
	{
		ClearChecks();
		for(DWORD ii = 0; ii < iwadfile->LumpCount(); ii++)
		{
			FResourceLump *lump = iwadfile->GetLump(ii);

			CheckLumpName(lump->Name);
			if (lump->FullName.IsNotEmpty())
			{
				if (strnicmp(lump->FullName, "maps/", 5) == 0)
				{
					FString mapname(&lump->FullName[5], strcspn(&lump->FullName[5], "."));
					CheckLumpName(mapname);
				}
			}
		}
		delete iwadfile;
	}
	return GetIWadInfo();
}